

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::basisu_transcoder::get_image_level_info
          (basisu_transcoder *this,void *pData,uint32_t data_size,
          basisu_image_level_info *image_info,uint32_t image_index,uint32_t level_index)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  uint *in_RCX;
  long in_RSI;
  undefined8 in_RDI;
  uint in_R8D;
  uint in_R9D;
  basis_slice_desc *slice_desc;
  basis_slice_desc *pSlice_descs;
  basis_file_header *pHeader;
  int slice_index;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar5;
  void *in_stack_ffffffffffffffb0;
  basisu_transcoder *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  long lVar6;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  bool local_1;
  
  bVar1 = validate_header_quick
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     (uint32_t)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    uVar2 = find_first_slice_index
                      ((basisu_transcoder *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc0,
                       (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                       (uint32_t)in_stack_ffffffffffffffb8,
                       (uint32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    if ((int)uVar2 < 0) {
      local_1 = false;
    }
    else {
      uVar5 = in_R8D;
      lVar6 = in_RSI;
      uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 0x11));
      if (uVar5 < uVar3) {
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint<4U> *)CONCAT44(uVar5,in_stack_ffffffffffffffa0));
        lVar4 = in_RSI + (ulong)uVar3 + (long)(int)uVar2 * 0x17;
        *in_RCX = in_R8D;
        in_RCX[1] = in_R9D;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar6 + 0x14));
        if (uVar3 == 0) {
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar6 + 0x15));
          *(bool *)(in_RCX + 0xe) = (uVar3 & 4) != 0;
        }
        else {
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar4 + 4));
          *(bool *)(in_RCX + 0xe) = (uVar3 & 1) != 0;
        }
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar4 + 4));
        *(bool *)((long)in_RCX + 0x39) = (uVar3 & 2) != 0;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar4 + 9));
        in_RCX[4] = uVar3 << 2;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar4 + 0xb));
        in_RCX[5] = uVar3 << 2;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar4 + 5));
        in_RCX[2] = uVar3;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar4 + 7));
        in_RCX[3] = uVar3;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar4 + 9));
        in_RCX[6] = uVar3;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar4 + 0xb));
        in_RCX[7] = uVar3;
        in_RCX[8] = in_RCX[6] * in_RCX[7];
        in_RCX[9] = uVar2;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint<4U> *)CONCAT44(uVar5,in_stack_ffffffffffffffa0));
        in_RCX[10] = uVar3;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint<4U> *)CONCAT44(uVar5,in_stack_ffffffffffffffa0));
        in_RCX[0xb] = uVar3;
        in_RCX[0xc] = 0;
        in_RCX[0xd] = 0;
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar6 + 0x14));
        if ((uVar3 == 0) &&
           (uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                              ((packed_uint *)(lVar6 + 0x15)), (uVar3 & 4) != 0)) {
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(lVar6 + 0xe));
          if ((int)uVar3 <= (int)(uVar2 + 1)) {
            __assert_fail("(slice_index + 1) < (int)pHeader->m_total_slices",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x27cc,
                          "bool basist::basisu_transcoder::get_image_level_info(const void *, uint32_t, basisu_image_level_info &, uint32_t, uint32_t) const"
                         );
          }
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                            ((packed_uint<4U> *)CONCAT44(uVar5,in_stack_ffffffffffffffa0));
          in_RCX[0xc] = uVar3;
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                            ((packed_uint<4U> *)CONCAT44(uVar5,in_stack_ffffffffffffffa0));
          in_RCX[0xd] = uVar3;
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool basisu_transcoder::get_image_level_info(const void* pData, uint32_t data_size, basisu_image_level_info& image_info, uint32_t image_index, uint32_t level_index) const
	{
		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_info: validate_file_checksums failed\n");
			return false;
		}

		int slice_index = find_first_slice_index(pData, data_size, image_index, level_index);
		if (slice_index < 0)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_info: failed finding slice\n");
			return false;
		}

		const basis_file_header* pHeader = static_cast<const basis_file_header*>(pData);

		if (image_index >= pHeader->m_total_images)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_info: invalid image_index\n");
			return false;
		}

		const basis_slice_desc* pSlice_descs = reinterpret_cast<const basis_slice_desc*>(static_cast<const uint8_t*>(pData) + pHeader->m_slice_desc_file_ofs);

		const basis_slice_desc& slice_desc = pSlice_descs[slice_index];

		image_info.m_image_index = image_index;
		image_info.m_level_index = level_index;
		
		// For ETC1S, if anything has alpha all images have alpha. For UASTC, we only report alpha when the image actually has alpha.
		if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
			image_info.m_alpha_flag = (pHeader->m_flags & cBASISHeaderFlagHasAlphaSlices) != 0;
		else
			image_info.m_alpha_flag = (slice_desc.m_flags & cSliceDescFlagsHasAlpha) != 0;
		
		image_info.m_iframe_flag = (slice_desc.m_flags & cSliceDescFlagsFrameIsIFrame) != 0;
		image_info.m_width = slice_desc.m_num_blocks_x * 4;
		image_info.m_height = slice_desc.m_num_blocks_y * 4;
		image_info.m_orig_width = slice_desc.m_orig_width;
		image_info.m_orig_height = slice_desc.m_orig_height;
		image_info.m_num_blocks_x = slice_desc.m_num_blocks_x;
		image_info.m_num_blocks_y = slice_desc.m_num_blocks_y;
		image_info.m_total_blocks = image_info.m_num_blocks_x * image_info.m_num_blocks_y;
		image_info.m_first_slice_index = slice_index;

		image_info.m_rgb_file_ofs = slice_desc.m_file_ofs;
		image_info.m_rgb_file_len = slice_desc.m_file_size;
		image_info.m_alpha_file_ofs = 0;
		image_info.m_alpha_file_len = 0;

		if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
		{
			if (pHeader->m_flags & cBASISHeaderFlagHasAlphaSlices)
			{
				assert((slice_index + 1) < (int)pHeader->m_total_slices);
				image_info.m_alpha_file_ofs = pSlice_descs[slice_index + 1].m_file_ofs;
				image_info.m_alpha_file_len = pSlice_descs[slice_index + 1].m_file_size;
			}
		}

		return true;
	}